

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O1

void __thiscall
Storage::Disk::PCMTrack::PCMTrack
          (PCMTrack *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *segments)

{
  pointer pPVar1;
  Time TVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  _Ct __n2;
  ulong uVar7;
  _Ct __n2_1;
  pointer pPVar8;
  _Ct __m2_1;
  uint uVar9;
  _Ct __m2;
  ulong __m;
  ulong uVar10;
  _Ct __m2_2;
  PCMSegment length_adjusted_segment;
  PCMSegment local_a0;
  ulong local_48;
  ulong local_40;
  Time local_38;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__PCMTrack_005aad18;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->segment_pointer_ = 0;
  this->is_resampled_clone_ = false;
  pPVar8 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar8 == pPVar1) {
    uVar9 = 1;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar7 = 1;
    do {
      Time::Time(&local_a0.length_of_a_bit,
                 (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                        (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
                 (ulong)(pPVar8->length_of_a_bit).length,(ulong)(pPVar8->length_of_a_bit).clock_rate
                );
      uVar5 = uVar7;
      uVar9 = uVar4;
      if (local_a0.length_of_a_bit.length != 0) {
        uVar5 = (ulong)local_a0.length_of_a_bit >> 0x20;
        uVar9 = local_a0.length_of_a_bit.length;
        if (uVar4 != 0) {
          if ((uint)uVar7 == local_a0.length_of_a_bit.clock_rate) {
            __m = ((ulong)local_a0.length_of_a_bit & 0xffffffff) + (ulong)uVar4;
          }
          else {
            __m = ((ulong)local_a0.length_of_a_bit & 0xffffffff) * uVar7 + uVar4 * uVar5;
            uVar7 = uVar7 * uVar5;
          }
          if ((uVar7 | __m) >> 0x20 == 0) {
LAB_0044a3d4:
            uVar5 = uVar7 & 0xffffffff;
            uVar9 = (uint)__m;
          }
          else {
            uVar5 = 1;
            if (__m == 0) {
              uVar9 = 0;
            }
            else {
              uVar10 = __m;
              if (((uVar7 | __m) & 0xf) == 0) {
                do {
                  __m = uVar10 >> 4;
                  uVar4 = (uint)uVar7;
                  uVar9 = (uint)uVar10;
                  uVar7 = uVar7 >> 4;
                  uVar10 = __m;
                } while (((uVar9 | uVar4) & 0xf0) == 0);
              }
              uVar4 = ((uint)__m | (uint)uVar7) & 1;
              while (uVar4 == 0) {
                uVar4 = (uint)uVar7;
                uVar7 = uVar7 >> 1;
                uVar4 = ((uint)__m | uVar4) & 2;
                __m = __m >> 1;
              }
              if ((__m >> 0x20 != 0) || (uVar7 >> 0x20 != 0)) {
                uVar6 = std::__detail::__gcd<unsigned_long>(__m,uVar7);
                __m = __m / uVar6;
                uVar7 = uVar7 / uVar6;
                do {
                  if (__m >> 0x20 == 0) {
                    if (uVar7 >> 0x20 == 0) break;
                  }
                  else if (uVar7 < 2) break;
                  __m = __m >> 1;
                  uVar7 = uVar7 >> 1;
                } while( true );
              }
              uVar9 = 0xffffffff;
              if ((__m >> 0x20 == 0) && (uVar7 >> 0x20 == 0)) goto LAB_0044a3d4;
            }
          }
        }
      }
      uVar4 = uVar9;
      uVar9 = (uint)uVar5;
      pPVar8 = pPVar8 + 1;
      uVar7 = uVar5;
    } while (pPVar8 != pPVar1);
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(uVar4,uVar9);
  pPVar8 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (segments->
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar8 != pPVar1) {
    local_40 = (ulong)uVar9 / (ulong)uVar3;
    local_48 = (ulong)uVar4 / (ulong)uVar3;
    do {
      Time::Time(&local_a0.length_of_a_bit,
                 (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                        (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
                 (ulong)(pPVar8->length_of_a_bit).length,(ulong)(pPVar8->length_of_a_bit).clock_rate
                );
      Time::Time(&local_a0.length_of_a_bit,((ulong)local_a0.length_of_a_bit & 0xffffffff) * local_40
                 ,((ulong)local_a0.length_of_a_bit >> 0x20) * local_48);
      TVar2 = local_a0.length_of_a_bit;
      uVar7 = (ulong)local_a0.length_of_a_bit >> 0x20;
      uVar4 = std::__detail::__gcd<unsigned_int>
                        (local_a0.length_of_a_bit.length,local_a0.length_of_a_bit.clock_rate);
      local_a0.length_of_a_bit = pPVar8->length_of_a_bit;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_a0.data,&pPVar8->data);
      std::vector<bool,_std::allocator<bool>_>::vector(&local_a0.fuzzy_mask,&pPVar8->fuzzy_mask);
      Time::Time(&local_38,((ulong)TVar2 & 0xffffffff) / (ulong)uVar4,
                 (ulong)((*(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - *(int *)&(pPVar8->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p) * 8 +
                        (pPVar8->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
                 (uVar7 / uVar4));
      local_a0.length_of_a_bit = local_38;
      TVar2 = local_a0.length_of_a_bit;
      local_a0.length_of_a_bit.clock_rate = local_38.clock_rate;
      uVar4 = local_a0.length_of_a_bit.clock_rate;
      local_a0.length_of_a_bit = TVar2;
      uVar4 = std::__detail::__gcd<unsigned_int>(local_38.length,uVar4);
      local_a0.length_of_a_bit.clock_rate = local_a0.length_of_a_bit.clock_rate / uVar4;
      local_a0.length_of_a_bit.length = local_a0.length_of_a_bit.length / uVar4;
      std::
      vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
      ::emplace_back<Storage::Disk::PCMSegment&>
                ((vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
                  *)&this->segment_event_sources_,&local_a0);
      if (local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_a0.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_a0.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar1);
  }
  return;
}

Assistant:

PCMTrack::PCMTrack(const std::vector<PCMSegment> &segments) : PCMTrack() {
	// sum total length of all segments
	Time total_length;
	for(const auto &segment : segments) {
		total_length += segment.length_of_a_bit * unsigned(segment.data.size());
	}
	total_length.simplify();

	// each segment is then some proportion of the total; for them all to sum to 1 they'll
	// need to be adjusted to be
	for(const auto &segment : segments) {
		Time original_length_of_segment = segment.length_of_a_bit * unsigned(segment.data.size());
		Time proportion_of_whole = original_length_of_segment / total_length;
		proportion_of_whole.simplify();
		PCMSegment length_adjusted_segment = segment;
		length_adjusted_segment.length_of_a_bit = proportion_of_whole / unsigned(segment.data.size());
		length_adjusted_segment.length_of_a_bit.simplify();
		segment_event_sources_.emplace_back(length_adjusted_segment);
	}
}